

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void duckdb::TemplatedWritePlain<long,long,duckdb::ParquetTimestampSOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  long lVar1;
  _func_int **pp_Var2;
  NumericStatisticsState<long,_long,_duckdb::BaseParquetOperator> *numeric_stats;
  idx_t iVar3;
  
  lVar1 = *(long *)(col + 0x20);
  iVar3 = chunk_start;
  if (chunk_start <= chunk_end && chunk_end - chunk_start != 0) {
    do {
      pp_Var2 = (_func_int **)
                duckdb::Timestamp::FromEpochSecondsPossiblyInfinite(*(long *)(lVar1 + iVar3 * 8));
      if ((long)pp_Var2 < (long)stats[1]._vptr_ColumnWriterStatistics) {
        stats[1]._vptr_ColumnWriterStatistics = pp_Var2;
      }
      if ((long)stats[2]._vptr_ColumnWriterStatistics < (long)pp_Var2) {
        stats[2]._vptr_ColumnWriterStatistics = pp_Var2;
      }
      iVar3 = iVar3 + 1;
    } while (chunk_end != iVar3);
  }
  (*(code *)**(undefined8 **)mask)(mask,chunk_start * 8 + lVar1,(chunk_end - chunk_start) * 8);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}